

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_hashtable.cpp
# Opt level: O1

idx_t __thiscall
duckdb::JoinHashTable::PrepareKeys
          (JoinHashTable *this,DataChunk *keys,
          vector<duckdb::TupleDataVectorFormat,_true> *vector_data,SelectionVector **current_sel,
          SelectionVector *sel,bool build_side)

{
  sel_t *psVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  bool bVar5;
  SelectionVector *pSVar6;
  reference pvVar7;
  idx_t iVar8;
  idx_t iVar9;
  idx_t iVar10;
  undefined7 in_register_00000089;
  idx_t iVar11;
  idx_t iVar12;
  size_type __n;
  reference rVar13;
  
  pSVar6 = FlatVector::IncrementalSelectionVector();
  *current_sel = pSVar6;
  iVar8 = keys->count;
  if (((int)CONCAT71(in_register_00000089,build_side) != 0) &&
     (bVar5 = PropagatesBuildSide(this->join_type), bVar5)) {
    return iVar8;
  }
  if ((keys->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (keys->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    iVar9 = iVar8;
    do {
      iVar8 = iVar9;
      if ((((this->join_type != MARK) ||
           ((this->correlated_mark_join_info).correlated_types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->correlated_mark_join_info).correlated_types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish)) &&
          (rVar13 = vector<bool,_true>::get<true>(&this->null_values_are_equal,__n),
          (*rVar13._M_p & rVar13._M_mask) == 0)) &&
         (pvVar7 = vector<duckdb::TupleDataVectorFormat,_true>::operator[](vector_data,__n),
         (pvVar7->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
         (unsigned_long *)0x0)) {
        if (iVar9 == 0) {
          iVar8 = 0;
        }
        else {
          psVar1 = (*current_sel)->sel_vector;
          puVar2 = (pvVar7->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                   validity_mask;
          psVar3 = ((pvVar7->unified).sel)->sel_vector;
          psVar4 = sel->sel_vector;
          iVar8 = 0;
          iVar10 = 0;
          do {
            iVar11 = iVar10;
            if (psVar1 != (sel_t *)0x0) {
              iVar11 = (idx_t)psVar1[iVar10];
            }
            iVar12 = iVar11;
            if (psVar3 != (sel_t *)0x0) {
              iVar12 = (idx_t)psVar3[iVar11];
            }
            if ((puVar2 == (unsigned_long *)0x0) ||
               ((puVar2[iVar12 >> 6] >> (iVar12 & 0x3f) & 1) != 0)) {
              psVar4[iVar8] = (sel_t)iVar11;
              iVar8 = iVar8 + 1;
            }
            iVar10 = iVar10 + 1;
          } while (iVar9 != iVar10);
        }
        *current_sel = sel;
      }
      __n = __n + 1;
      iVar9 = iVar8;
    } while (__n < (ulong)(((long)(keys->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(keys->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return iVar8;
}

Assistant:

idx_t JoinHashTable::PrepareKeys(DataChunk &keys, vector<TupleDataVectorFormat> &vector_data,
                                 const SelectionVector *&current_sel, SelectionVector &sel, bool build_side) {
	// figure out which keys are NULL, and create a selection vector out of them
	current_sel = FlatVector::IncrementalSelectionVector();
	idx_t added_count = keys.size();
	if (build_side && PropagatesBuildSide(join_type)) {
		// in case of a right or full outer join, we cannot remove NULL keys from the build side
		return added_count;
	}

	for (idx_t col_idx = 0; col_idx < keys.ColumnCount(); col_idx++) {
		// see internal issue 3717.
		if (join_type == JoinType::MARK && !correlated_mark_join_info.correlated_types.empty()) {
			continue;
		}
		if (null_values_are_equal[col_idx]) {
			continue;
		}
		auto &col_key_data = vector_data[col_idx].unified;
		if (col_key_data.validity.AllValid()) {
			continue;
		}
		added_count = FilterNullValues(col_key_data, *current_sel, added_count, sel);
		// null values are NOT equal for this column, filter them out
		current_sel = &sel;
	}
	return added_count;
}